

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cc
# Opt level: O0

int delete_if_mapped(X509_POLICY_NODE *node,void *data)

{
  int iVar1;
  undefined1 local_38 [8];
  POLICY_MAPPING mapping;
  POLICY_MAPPINGS *mappings;
  void *data_local;
  X509_POLICY_NODE *node_local;
  
  mapping.subjectDomainPolicy = (ASN1_OBJECT *)data;
  iVar1 = sk_POLICY_MAPPING_is_sorted((stack_st_POLICY_MAPPING *)data);
  if (iVar1 == 0) {
    __assert_fail("sk_POLICY_MAPPING_is_sorted(mappings)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                  ,0x14d,"int delete_if_mapped(X509_POLICY_NODE *, void *)");
  }
  local_38 = (undefined1  [8])node->policy;
  iVar1 = sk_POLICY_MAPPING_find
                    ((stack_st_POLICY_MAPPING *)mapping.subjectDomainPolicy,(size_t *)0x0,
                     (POLICY_MAPPING *)local_38);
  if (iVar1 != 0) {
    x509_policy_node_free(node);
  }
  node_local._4_4_ = (uint)(iVar1 != 0);
  return node_local._4_4_;
}

Assistant:

static int delete_if_mapped(X509_POLICY_NODE *node, void *data) {
  const POLICY_MAPPINGS *mappings = reinterpret_cast<POLICY_MAPPINGS *>(data);
  // |mappings| must have been sorted by |compare_issuer_policy|.
  assert(sk_POLICY_MAPPING_is_sorted(mappings));
  POLICY_MAPPING mapping;
  mapping.issuerDomainPolicy = node->policy;
  if (!sk_POLICY_MAPPING_find(mappings, /*out_index=*/NULL, &mapping)) {
    return 0;
  }
  x509_policy_node_free(node);
  return 1;
}